

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.hpp
# Opt level: O2

PositiveSet<double,_4UL> *
ruckig::roots::solve_quart_monic
          (PositiveSet<double,_4UL> *__return_storage_ptr__,double a,double b,double c,double d)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lStack_90;
  array<double,_3UL> x3;
  
  (__return_storage_ptr__->super_Set<double,_4UL>).size = 0;
  if (ABS(d) < 2.220446049250313e-16) {
    if (ABS(c) < 2.220446049250313e-16) {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar4 = a * a + b * -4.0;
      if (2.220446049250313e-16 <= ABS(dVar4)) {
        if (dVar4 <= 0.0) {
          return __return_storage_ptr__;
        }
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar7 = (-a - dVar4) * 0.5;
        if (0.0 <= dVar7) {
          (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = dVar7;
          (__return_storage_ptr__->super_Set<double,_4UL>).size = 2;
          lStack_90 = 2;
        }
        else {
          lStack_90 = 1;
        }
        dVar4 = (dVar4 - a) * 0.5;
        if (dVar4 < 0.0) {
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[lStack_90] = dVar4;
        (__return_storage_ptr__->super_Set<double,_4UL>).size = lStack_90 + 1;
        return __return_storage_ptr__;
      }
      if (a * -0.5 < 0.0) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = a * -0.5;
LAB_00165e46:
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 2;
      return __return_storage_ptr__;
    }
    if ((ABS(a) < 2.220446049250313e-16) && (ABS(b) < 2.220446049250313e-16)) {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar4 = cbrt(c);
      if (0.0 < dVar4) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = -dVar4;
      goto LAB_00165e46;
    }
  }
  iVar2 = solve_resolvent(&x3,-b,a * c + d * -4.0,b * 4.0 * d + (-a * a * d - c * c));
  if ((iVar2 != 1) &&
     (x3._M_elems[0] =
           (double)(~-(ulong)(ABS(x3._M_elems[0]) < ABS(x3._M_elems[1])) & (ulong)x3._M_elems[0] |
                   (ulong)x3._M_elems[1] & -(ulong)(ABS(x3._M_elems[0]) < ABS(x3._M_elems[1]))),
     ABS(x3._M_elems[0]) < ABS(x3._M_elems[2]))) {
    x3._M_elems[0] = x3._M_elems[2];
  }
  dVar4 = x3._M_elems[0] * x3._M_elems[0] + d * -4.0;
  if (2.220446049250313e-16 <= ABS(dVar4)) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar7 = (x3._M_elems[0] - dVar4) * 0.5;
    dVar4 = (x3._M_elems[0] + dVar4) * 0.5;
    auVar8._0_8_ = -a * dVar7 + c;
    auVar8._8_8_ = a * dVar4 + -c;
    auVar1._8_8_ = dVar4 - dVar7;
    auVar1._0_8_ = dVar4 - dVar7;
    auVar9 = divpd(auVar8,auVar1);
  }
  else {
    dVar4 = x3._M_elems[0] * 0.5;
    dVar5 = a * a + (b - x3._M_elems[0]) * -4.0;
    dVar7 = dVar4;
    if (2.220446049250313e-16 <= ABS(dVar5)) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      auVar9._0_8_ = (a - dVar5) * 0.5;
      auVar9._8_8_ = (dVar5 + a) * 0.5;
    }
    else {
      auVar9._0_8_ = a * 0.5;
      auVar9._8_8_ = auVar9._0_8_;
    }
  }
  dVar5 = auVar9._8_8_;
  dVar4 = dVar5 * dVar5 + dVar4 * -4.0;
  if (3.552713678800501e-15 <= ABS(dVar4)) {
    if (dVar4 <= 0.0) goto LAB_00166111;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar6 = (-dVar5 - dVar4) * 0.5;
    if (0.0 <= dVar6) {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar6;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
    }
    sVar3 = (size_t)(0.0 <= dVar6);
    dVar4 = (dVar4 - dVar5) * 0.5;
    if (dVar4 < 0.0) goto LAB_0016619e;
    (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar3] = dVar4;
    sVar3 = sVar3 + 1;
  }
  else {
    if (dVar5 * -0.5 < 0.0) {
LAB_00166111:
      sVar3 = 0;
      goto LAB_0016619e;
    }
    (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar5 * -0.5;
    sVar3 = 1;
  }
  (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar3;
LAB_0016619e:
  dVar5 = auVar9._0_8_;
  dVar4 = dVar5 * dVar5 + dVar7 * -4.0;
  if (3.552713678800501e-15 <= ABS(dVar4)) {
    if (dVar4 <= 0.0) {
      return __return_storage_ptr__;
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar7 = (-dVar5 - dVar4) * 0.5;
    if (0.0 <= dVar7) {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar3] = dVar7;
      sVar3 = sVar3 + 1;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar3;
    }
    dVar5 = (dVar4 - dVar5) * 0.5;
  }
  else {
    dVar5 = dVar5 * -0.5;
  }
  if (0.0 <= dVar5) {
    (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar3] = dVar5;
    (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline PositiveSet<double, 4> solve_quart_monic(double a, double b, double c, double d) {
    PositiveSet<double, 4> roots;

    if (std::abs(d) < DBL_EPSILON) {
        if (std::abs(c) < DBL_EPSILON) {
            roots.insert(0.0);

            const double D = a * a - 4 * b;
            if (std::abs(D) < DBL_EPSILON) {
                roots.insert(-a / 2);
            } else if (D > 0.0) {
                const double sqrtD = std::sqrt(D);
                roots.insert((-a - sqrtD) / 2);
                roots.insert((-a + sqrtD) / 2);
            }
            return roots;
        }

        if (std::abs(a) < DBL_EPSILON && std::abs(b) < DBL_EPSILON) {
            roots.insert(0.0);
            roots.insert(-std::cbrt(c));
            return roots;
        }
    }

    const double a3 = -b;
    const double b3 = a * c - 4 * d;
    const double c3 = -a * a * d - c * c + 4 * b * d;

    std::array<double, 3> x3;
    const int number_zeroes = solve_resolvent(x3, a3, b3, c3);

    double y = x3[0];
    // Choosing Y with maximal absolute value.
    if (number_zeroes != 1) {
        if (std::abs(x3[1]) > std::abs(y)) {
            y = x3[1];
        }
        if (std::abs(x3[2]) > std::abs(y)) {
            y = x3[2];
        }
    }

    double q1, q2, p1, p2;

    double D = y * y - 4 * d;
    if (std::abs(D) < DBL_EPSILON) {
        q1 = q2 = y / 2;
        D = a * a - 4 * (b - y);
        if (std::abs(D) < DBL_EPSILON) {
            p1 = p2 = a / 2;
        } else {
            const double sqrtD = std::sqrt(D);
            p1 = (a + sqrtD) / 2;
            p2 = (a - sqrtD) / 2;
        }
    } else {
        const double sqrtD = std::sqrt(D);
        q1 = (y + sqrtD) / 2;
        q2 = (y - sqrtD) / 2;
        p1 = (a * q1 - c) / (q1 - q2);
        p2 = (c - a * q2) / (q1 - q2);
    }

    constexpr double eps {16 * DBL_EPSILON};

    D = p1 * p1 - 4 * q1;
    if (std::abs(D) < eps) {
        roots.insert(-p1 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p1 - sqrtD) / 2);
        roots.insert((-p1 + sqrtD) / 2);
    }

    D = p2 * p2 - 4 * q2;
    if (std::abs(D) < eps) {
        roots.insert(-p2 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p2 - sqrtD) / 2);
        roots.insert((-p2 + sqrtD) / 2);
    }

    return roots;
}